

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupOrderDfsReverse(Gia_Man_t *p)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  Gia_Man_t *pNew;
  size_t sVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  
  Gia_ManFillValue(p);
  pNew = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  pNew->pName = pcVar7;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  pNew->pSpec = pcVar7;
  p->pObjs->Value = 0;
  uVar13 = (ulong)p->vCos->nSize;
  if (0 < (long)uVar13) {
    do {
      if ((long)p->vCos->nSize < (long)uVar13) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = p->vCos->pArray[uVar13 - 1];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001d86e7;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Gia_ManDupOrderDfs_rec(pNew,p,p->pObjs + iVar1);
      bVar5 = 1 < uVar13;
      uVar13 = uVar13 - 1;
    } while (bVar5);
  }
  pVVar9 = p->vCis;
  uVar10 = pVVar9->nSize;
  uVar13 = (ulong)uVar10;
  if (0 < (int)uVar10) {
    lVar12 = 0;
    do {
      uVar10 = (uint)uVar13;
      lVar11 = (long)pVVar9->pArray[lVar12];
      if ((lVar11 < 0) || (p->nObjs <= pVVar9->pArray[lVar12])) {
LAB_001d86e7:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      if (pGVar3[lVar11].Value == 0xffffffff) {
        pGVar8 = Gia_ManAppendObj(pNew);
        uVar13 = *(ulong *)pGVar8;
        *(ulong *)pGVar8 = uVar13 | 0x9fffffff;
        *(ulong *)pGVar8 =
             uVar13 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(pNew->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar4 = pNew->pObjs;
        if ((pGVar8 < pGVar4) || (pGVar4 + pNew->nObjs <= pGVar8)) {
LAB_001d8706:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(pNew->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * -0x55555555);
        pGVar4 = pNew->pObjs;
        if ((pGVar8 < pGVar4) || (pGVar4 + pNew->nObjs <= pGVar8)) goto LAB_001d8706;
        pGVar3[lVar11].Value = (int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * 0x55555556;
        pVVar9 = p->vCis;
      }
      lVar12 = lVar12 + 1;
      uVar10 = pVVar9->nSize;
      uVar13 = (ulong)(int)uVar10;
    } while (lVar12 < (long)uVar13);
  }
  if (pNew->vCis->nSize == uVar10) {
    Gia_ManDupRemapCis(pNew,p);
    Gia_ManDupRemapCos(pNew,p);
    Gia_ManDupRemapEquiv(pNew,p);
    Gia_ManSetRegNum(pNew,p->nRegs);
    return pNew;
  }
  __assert_fail("Gia_ManCiNum(pNew) == Gia_ManCiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                ,0x1e4,"Gia_Man_t *Gia_ManDupOrderDfsReverse(Gia_Man_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupOrderDfsReverse( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCoReverse( p, pObj, i )
        Gia_ManDupOrderDfs_rec( pNew, p, pObj );
    Gia_ManForEachCi( p, pObj, i )
        if ( !~pObj->Value )
            pObj->Value = Gia_ManAppendCi(pNew);
    assert( Gia_ManCiNum(pNew) == Gia_ManCiNum(p) );
    Gia_ManDupRemapCis( pNew, p );
    Gia_ManDupRemapCos( pNew, p );
    Gia_ManDupRemapEquiv( pNew, p );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}